

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O2

void test_cio_write_buffer_splice(void)

{
  cio_write_buffer *pcVar1;
  uint data1;
  cio_write_buffer local_100;
  cio_write_buffer wbh_two;
  char data2 [13];
  cio_write_buffer wb2_two;
  cio_write_buffer wb1_two;
  cio_write_buffer wb2_one;
  cio_write_buffer wb1_one;
  
  local_100.data.head.q_len = 0;
  local_100.data.element.length = 0;
  data1 = 0x12;
  wb1_one.data.element.length = 4;
  local_100.next = &local_100;
  local_100.prev = &local_100;
  wb1_one.data.head.q_len = (size_t)&data1;
  cio_write_buffer_queue_tail(&local_100,&wb1_one);
  builtin_strncpy(data2 + 8,"rld!",5);
  builtin_strncpy(data2,"Hello Wo",8);
  wb2_one.data.element.length = 0xd;
  wb2_one.data.head.q_len = (size_t)data2;
  cio_write_buffer_queue_tail(&local_100,&wb2_one);
  UnityAssertEqualNumber
            (2,local_100.data.head.q_len,
             "Number of elements in write buffer not \'2\' after inserting second element!",0xdf,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x11,local_100.data.element.length,"Write buffer total length not correct!",0xe0,
             UNITY_DISPLAY_STYLE_INT);
  wbh_two.data = (anon_union_16_2_70f96463_for_data)0x0;
  wb1_two.data.element.length = 4;
  wbh_two.next = &wbh_two;
  wbh_two.prev = &wbh_two;
  wb1_two.data.head.q_len = (size_t)&data1;
  cio_write_buffer_queue_tail(&wbh_two,&wb1_two);
  wb2_two.data.element.length = 0xd;
  wb2_two.data.head.q_len = (size_t)data2;
  cio_write_buffer_queue_tail(&wbh_two,&wb2_two);
  UnityAssertEqualNumber
            (2,wbh_two.data.head.q_len,
             "Number of elements in write buffer not \'2\' after inserting second element!",0xed,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x11,wbh_two.data.element.length,"Write buffer total length not correct!",0xee,
             UNITY_DISPLAY_STYLE_INT);
  if (wbh_two.next == &wbh_two) {
  }
  else {
    (local_100.prev)->next = wbh_two.next;
    (wbh_two.next)->prev = local_100.prev;
    (wbh_two.prev)->next = &local_100;
    local_100.prev = wbh_two.prev;
    local_100.data.head.q_len = local_100.data.head.q_len + wbh_two.data.head.q_len;
    local_100.data.element.length = local_100.data.element.length + wbh_two.data.element.length;
    wbh_two.data = (anon_union_16_2_70f96463_for_data)0x0;
    wbh_two.data.head.q_len = 0;
    wbh_two.next = &wbh_two;
    wbh_two.prev = &wbh_two;
  }
  UnityAssertEqualNumber
            (0,wbh_two.data.head.q_len,
             "Number of elements in write buffer two not \'0\' after splicing to another list!",0xf2
             ,UNITY_DISPLAY_STYLE_INT);
  if (wbh_two.next == &wbh_two) {
    UnityAssertEqualNumber
              (4,local_100.data.head.q_len,
               "Number of elements in write buffer two not \'4\' after splicing from another list!",
               0xf5,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0x22,local_100.data.element.length,"Write buffer total length not correct!",0xf6,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,wbh_two.data.element.length,"Write buffer total length not correct!",0xf7,
               UNITY_DISPLAY_STYLE_INT);
    pcVar1 = cio_write_buffer_queue_dequeue(&local_100);
    UnityAssertEqualNumber
              ((UNITY_INT)&wb1_one,(UNITY_INT)pcVar1,
               "First dequeued write buffer is not correct after splicing!",0xfa,
               UNITY_DISPLAY_STYLE_INT);
    pcVar1 = cio_write_buffer_queue_dequeue(&local_100);
    UnityAssertEqualNumber
              ((UNITY_INT)&wb2_one,(UNITY_INT)pcVar1,
               "Second dequeued write buffer is not correct after splicing!",0xfc,
               UNITY_DISPLAY_STYLE_INT);
    pcVar1 = cio_write_buffer_queue_dequeue(&local_100);
    UnityAssertEqualNumber
              ((UNITY_INT)&wb1_two,(UNITY_INT)pcVar1,
               "Third dequeued write buffer is not correct after splicing!",0xfe,
               UNITY_DISPLAY_STYLE_INT);
    pcVar1 = cio_write_buffer_queue_dequeue(&local_100);
    UnityAssertEqualNumber
              ((UNITY_INT)&wb2_two,(UNITY_INT)pcVar1,
               "Forth dequeued write buffer is not correct after splicing!",0x100,
               UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("Write buffer not empty after splicing!",0xf3);
}

Assistant:

static void test_cio_write_buffer_splice(void)
{
	struct cio_write_buffer wbh_one;
	cio_write_buffer_head_init(&wbh_one);

	unsigned int data1 = 0x12;
	struct cio_write_buffer wb1_one;
	cio_write_buffer_element_init(&wb1_one, &data1, sizeof(data1));
	cio_write_buffer_queue_tail(&wbh_one, &wb1_one);

	const char data2[] = "Hello World!";
	struct cio_write_buffer wb2_one;
	cio_write_buffer_const_element_init(&wb2_one, data2, sizeof(data2));
	cio_write_buffer_queue_tail(&wbh_one, &wb2_one);
	size_t num_elements = cio_write_buffer_get_num_buffer_elements(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements in write buffer not '2' after inserting second element!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh_one), "Write buffer total length not correct!");

	struct cio_write_buffer wbh_two;
	cio_write_buffer_head_init(&wbh_two);

	struct cio_write_buffer wb1_two;
	cio_write_buffer_element_init(&wb1_two, &data1, sizeof(data1));
	cio_write_buffer_queue_tail(&wbh_two, &wb1_two);

	struct cio_write_buffer wb2_two;
	cio_write_buffer_const_element_init(&wb2_two, data2, sizeof(data2));
	cio_write_buffer_queue_tail(&wbh_two, &wb2_two);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh_two);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements in write buffer not '2' after inserting second element!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh_two), "Write buffer total length not correct!");

	cio_write_buffer_splice(&wbh_two, &wbh_one);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh_two);
	TEST_ASSERT_EQUAL_MESSAGE(0, num_elements, "Number of elements in write buffer two not '0' after splicing to another list!");
	TEST_ASSERT_TRUE_MESSAGE(cio_write_buffer_queue_empty(&wbh_two), "Write buffer not empty after splicing!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(4, num_elements, "Number of elements in write buffer two not '4' after splicing from another list!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2) + sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh_one), "Write buffer total length not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_total_size(&wbh_two), "Write buffer total length not correct!");

	struct cio_write_buffer *dequeued_wb = cio_write_buffer_queue_dequeue(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(&wb1_one, dequeued_wb, "First dequeued write buffer is not correct after splicing!");
	dequeued_wb = cio_write_buffer_queue_dequeue(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(&wb2_one, dequeued_wb, "Second dequeued write buffer is not correct after splicing!");
	dequeued_wb = cio_write_buffer_queue_dequeue(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(&wb1_two, dequeued_wb, "Third dequeued write buffer is not correct after splicing!");
	dequeued_wb = cio_write_buffer_queue_dequeue(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(&wb2_two, dequeued_wb, "Forth dequeued write buffer is not correct after splicing!");
}